

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::RawBufferAsyncModifyComplete_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  int iVar1;
  int iVar2;
  ScriptContext *pSVar3;
  JsRTRawBufferModifyAction *pJVar4;
  Var aValue;
  ArrayBuffer *pAVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auStack_48 [8];
  TTDPendingAsyncBufferModification pendingAsyncInfo;
  
  pSVar3 = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (pSVar3 == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar4 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferModifyAction,(TTD::NSLogEvents::EventKind)65>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar4->Trgt);
  pAVar5 = Js::VarTo<Js::ArrayBuffer>(aValue);
  iVar1 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                    (pAVar5);
  pendingAsyncInfo._8_8_ = ZEXT48(pJVar4->Index);
  iVar2 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                    (pAVar5);
  auStack_48 = (undefined1  [8])0x0;
  pendingAsyncInfo.ArrayBufferVar = (Var)0x0;
  ScriptContextTTD::GetFromAsyncPendingList
            (pSVar3->TTDContextInfo,(TTDPendingAsyncBufferModification *)auStack_48,
             (byte *)((ulong)pJVar4->Length + (ulong)pJVar4->Index + CONCAT44(extraout_var_00,iVar2)
                     ));
  if (((undefined1  [8])pAVar5 == auStack_48) &&
     (pJVar4->Index == (uint32)pendingAsyncInfo.ArrayBufferVar)) {
    js_memcpy_s((void *)(CONCAT44(extraout_var,iVar1) + pendingAsyncInfo._8_8_),
                (ulong)pJVar4->Length,pJVar4->Data,(ulong)pJVar4->Length);
    return;
  }
  TTDAbort_unrecoverable_error("Something is not right.");
}

Assistant:

void RawBufferAsyncModifyComplete_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTRawBufferModifyAction* action = GetInlineEventDataAs<JsRTRawBufferModifyAction, EventKind::RawBufferAsyncModifyComplete>(evt);
            Js::Var trgt = InflateVarInReplay(executeContext, action->Trgt); //never cross context

            const Js::ArrayBuffer* dstBuff = Js::VarTo<Js::ArrayBuffer>(trgt);
            byte* copyBuff = dstBuff->GetBuffer() + action->Index;
            byte* finalModPos = dstBuff->GetBuffer() + action->Index + action->Length;

            TTDPendingAsyncBufferModification pendingAsyncInfo = { 0 };
            ctx->TTDContextInfo->GetFromAsyncPendingList(&pendingAsyncInfo, finalModPos);
            TTDAssert(dstBuff == pendingAsyncInfo.ArrayBufferVar && action->Index == pendingAsyncInfo.Index, "Something is not right.");

            js_memcpy_s(copyBuff, action->Length, action->Data, action->Length);
        }